

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileExecutableTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator
          (cmMakefileExecutableTargetGenerator *this,cmGeneratorTarget *target)

{
  string *config;
  cmOSXBundleGenerator *this_00;
  
  cmMakefileTargetGenerator::cmMakefileTargetGenerator
            (&this->super_cmMakefileTargetGenerator,target);
  (this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.
  _vptr_cmCommonTargetGenerator = (_func_int **)&PTR__cmMakefileExecutableTargetGenerator_00692c00;
  (this->DeviceLinkObject)._M_dataplus._M_p = (pointer)&(this->DeviceLinkObject).field_2;
  (this->DeviceLinkObject)._M_string_length = 0;
  (this->DeviceLinkObject).field_2._M_local_buf[0] = '\0';
  (this->super_cmMakefileTargetGenerator).CustomCommandDriver = OnDepends;
  config = &(this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.ConfigName;
  cmGeneratorTarget::GetExecutableNames
            ((this->super_cmMakefileTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
             &(this->super_cmMakefileTargetGenerator).TargetNameOut,
             &(this->super_cmMakefileTargetGenerator).TargetNameReal,
             &(this->super_cmMakefileTargetGenerator).TargetNameImport,
             &(this->super_cmMakefileTargetGenerator).TargetNamePDB,config);
  this_00 = (cmOSXBundleGenerator *)operator_new(0x40);
  cmOSXBundleGenerator::cmOSXBundleGenerator(this_00,target,config);
  (this->super_cmMakefileTargetGenerator).OSXBundleGenerator = this_00;
  this_00->MacContentFolders = &(this->super_cmMakefileTargetGenerator).MacContentFolders;
  return;
}

Assistant:

cmMakefileExecutableTargetGenerator::cmMakefileExecutableTargetGenerator(
  cmGeneratorTarget* target)
  : cmMakefileTargetGenerator(target)
{
  this->CustomCommandDriver = OnDepends;
  this->GeneratorTarget->GetExecutableNames(
    this->TargetNameOut, this->TargetNameReal, this->TargetNameImport,
    this->TargetNamePDB, this->ConfigName);

  this->OSXBundleGenerator =
    new cmOSXBundleGenerator(target, this->ConfigName);
  this->OSXBundleGenerator->SetMacContentFolders(&this->MacContentFolders);
}